

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

void __thiscall Json::Reader::readNumber(Reader *this)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  
  pbVar1 = (byte *)this->end_;
  pbVar2 = (byte *)this->current_;
  bVar4 = 0x30;
  while ((byte)(bVar4 - 0x30) < 10) {
    bVar4 = 0;
    this->current_ = (Location)pbVar2;
    if (pbVar2 < pbVar1) {
      bVar4 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    }
  }
  if (bVar4 == 0x2e) {
    this->current_ = (Location)pbVar2;
    if (pbVar2 < pbVar1) goto LAB_004ed7ab;
    bVar4 = 0;
    while ((byte)(bVar4 - 0x30) < 10) {
      bVar4 = 0;
      this->current_ = (Location)pbVar2;
      if (pbVar2 < pbVar1) {
LAB_004ed7ab:
        bVar4 = *pbVar2;
        pbVar2 = pbVar2 + 1;
      }
    }
  }
  if ((bVar4 & 0xdf) == 0x45) {
    this->current_ = (Location)pbVar2;
    if (pbVar2 < pbVar1) {
      pbVar3 = pbVar2 + 1;
      bVar4 = *pbVar2;
      if ((bVar4 == 0x2d) || (bVar4 == 0x2b)) {
        this->current_ = (Location)pbVar3;
        if (pbVar3 < pbVar1) {
          pbVar2 = pbVar2 + 2;
          goto LAB_004ed80b;
        }
        bVar4 = 0;
      }
    }
    else {
      bVar4 = 0;
      pbVar3 = pbVar2;
    }
    while (((byte)(bVar4 - 0x30) < 10 && (this->current_ = (Location)pbVar3, pbVar3 < pbVar1))) {
      pbVar2 = pbVar3 + 1;
LAB_004ed80b:
      bVar4 = *pbVar3;
      pbVar3 = pbVar2;
    }
  }
  return;
}

Assistant:

void Reader::readNumber() {
  Location p = current_;
  char c = '0'; // stopgap for already consumed character
  // integral part
  while (c >= '0' && c <= '9')
    c = (current_ = p) < end_ ? *p++ : '\0';
  // fractional part
  if (c == '.') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
  // exponential part
  if (c == 'e' || c == 'E') {
    c = (current_ = p) < end_ ? *p++ : '\0';
    if (c == '+' || c == '-')
      c = (current_ = p) < end_ ? *p++ : '\0';
    while (c >= '0' && c <= '9')
      c = (current_ = p) < end_ ? *p++ : '\0';
  }
}